

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim_circuit.cpp
# Opt level: O2

void __thiscall
lsim::SimCircuit::SimCircuit(SimCircuit *this,Simulator *sim,ModelCircuit *circuit_desc)

{
  uint __line;
  char *__assertion;
  allocator local_19;
  
  this->m_circuit_desc = circuit_desc;
  this->m_sim = sim;
  (this->m_components)._M_h._M_buckets = &(this->m_components)._M_h._M_single_bucket;
  (this->m_components)._M_h._M_bucket_count = 1;
  (this->m_components)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_components)._M_h._M_element_count = 0;
  (this->m_components)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_components)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_components)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::__cxx11::string::string((string *)&this->m_name,"<unnamed>",&local_19);
  if (sim == (Simulator *)0x0) {
    __assertion = "sim";
    __line = 0x11;
  }
  else {
    if (circuit_desc != (ModelCircuit *)0x0) {
      return;
    }
    __assertion = "circuit_desc";
    __line = 0x12;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_circuit.cpp"
                ,__line,"lsim::SimCircuit::SimCircuit(Simulator *, ModelCircuit *)");
}

Assistant:

SimCircuit::SimCircuit(Simulator *sim, ModelCircuit *circuit_desc) :
        m_sim(sim),
        m_circuit_desc(circuit_desc),
        m_name("<unnamed>") {
    assert(sim);
    assert(circuit_desc);
}